

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lisp2c.c
# Opt level: O3

int LispIntToCInt(LispPTR lispint)

{
  ulong uVar1;
  uint uVar2;
  char msg [200];
  char acStack_d8 [200];
  
  uVar1 = (ulong)lispint;
  if ((lispint & 0xffff0000) == 0xf0000) {
    uVar2 = lispint | 0xffff0000;
  }
  else if ((lispint & 0xffff0000) == 0xe0000) {
    uVar2 = lispint & 0xffff;
  }
  else if ((*(ushort *)((ulong)(lispint >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
    if ((lispint & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar1);
    }
    uVar2 = *(uint *)(Lisp_world + uVar1);
  }
  else {
    sprintf(acStack_d8,"Arg 0x%x isn\'t a lisp integer.",uVar1);
    error(acStack_d8);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

int LispIntToCInt(LispPTR lispint) {
  switch ((0xFFFF0000 & lispint)) {
    case S_POSITIVE: return (lispint & 0xFFFF);
    case S_NEGATIVE: return (lispint | 0xFFFF0000);
    default:
      if (GetTypeNumber(lispint) == TYPE_FIXP) {
        return (*((int *)NativeAligned4FromLAddr(lispint)));
      } else {
        char msg[200];
        sprintf(msg, "Arg 0x%x isn't a lisp integer.", lispint);
        error(msg);
        /* NOTREACHED */
        return(0);
      }
  }
}